

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::SSETest_ExtremeValues_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::SSETest_ExtremeValues_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<libaom_test::FuncParam<long(*)(unsigned_char_const*,int,unsigned_char_const*,int,int,int)>,int>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x50);
  Test::Test(this_00);
  this_00[2]._vptr_Test = (_func_int **)0x0;
  this_00[2].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  *(undefined4 *)&this_00[3]._vptr_Test = 0;
  *(undefined4 *)
   &this_00[4].gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = 0xbaba;
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_010bc748;
  this_00[1]._vptr_Test = (_func_int **)&PTR__SSETest_ExtremeValues_Test_010bc788;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }